

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

define_directive * get_define_directive(token *macro_name)

{
  define_directive *pdVar1;
  Queue *pQVar2;
  Map *pMVar3;
  define_directive *ret;
  token *macro_name_local;
  
  pdVar1 = (define_directive *)malloc(0x30);
  pdVar1->macro_name = macro_name;
  pQVar2 = (Queue *)malloc(0x18);
  pdVar1->macro_tokens = pQVar2;
  Queue_Init(pdVar1->macro_tokens);
  pMVar3 = (Map *)malloc(0x810);
  pdVar1->arguments = pMVar3;
  Map_Init(pdVar1->arguments);
  pdVar1->number_of_arguments = 0;
  return pdVar1;
}

Assistant:

struct define_directive* get_define_directive(struct token* macro_name)
{
	struct define_directive *ret;
	ret=malloc(sizeof(struct token));
	ret->macro_name=macro_name;

	ret->macro_tokens=malloc(sizeof(struct Queue));
	Queue_Init(ret->macro_tokens);

	ret->arguments=malloc(sizeof(struct Map));
	Map_Init(ret->arguments);

	ret->number_of_arguments=0;

	return ret;
}